

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_writeSolutionPretty(void *highs,char *filename)

{
  HighsStatus HVar1;
  char *in_RSI;
  HighsInt in_stack_0000017c;
  string *in_stack_00000180;
  Highs *in_stack_00000188;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  HVar1 = Highs::writeSolution(in_stack_00000188,in_stack_00000180,in_stack_0000017c);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return HVar1;
}

Assistant:

HighsInt Highs_writeSolutionPretty(const void* highs, const char* filename) {
  return (HighsInt)((Highs*)highs)
      ->writeSolution(std::string(filename), kSolutionStylePretty);
}